

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

bool nullcInitMemoryModule(void)

{
  nullres nVar1;
  
  nVar1 = nullcBindModuleFunctionHelper<bool,NULLCArray,int>
                    ("std.memory",NULLCMemory::read_bool,"memory.read_bool",0);
  if ((((((((nVar1 != '\0') &&
           (nVar1 = nullcBindModuleFunctionHelper<char,NULLCArray,int>
                              ("std.memory",NULLCMemory::read_char,"memory.read_char",0),
           nVar1 != '\0')) &&
          (nVar1 = nullcBindModuleFunctionHelper<short,NULLCArray,int>
                             ("std.memory",NULLCMemory::read_short,"memory.read_short",0),
          nVar1 != '\0')) &&
         (((nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,int>
                              ("std.memory",NULLCMemory::read_int,"memory.read_int",0),
           nVar1 != '\0' &&
           (nVar1 = nullcBindModuleFunctionHelper<long_long,NULLCArray,int>
                              ("std.memory",NULLCMemory::read_long,"memory.read_long",0),
           nVar1 != '\0')) &&
          ((nVar1 = nullcBindModuleFunctionHelper<float,NULLCArray,int>
                              ("std.memory",NULLCMemory::read_float,"memory.read_float",0),
           nVar1 != '\0' &&
           ((nVar1 = nullcBindModuleFunctionHelper<double,NULLCArray,int>
                               ("std.memory",NULLCMemory::read_double,"memory.read_double",0),
            nVar1 != '\0' &&
            (nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                               ("std.memory",NULLCMemory::read_bool_array,"memory.read_bool_array",0
                               ), nVar1 != '\0')))))))) &&
        (nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                           ("std.memory",NULLCMemory::read_char_array,"memory.read_char_array",0),
        nVar1 != '\0')) &&
       (((nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                            ("std.memory",NULLCMemory::read_short_array,"memory.read_short_array",0)
         , nVar1 != '\0' &&
         (nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                            ("std.memory",NULLCMemory::read_int_array,"memory.read_int_array",0),
         nVar1 != '\0')) &&
        (nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                           ("std.memory",NULLCMemory::read_long_array,"memory.read_long_array",0),
        nVar1 != '\0')))) &&
      ((((nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                            ("std.memory",NULLCMemory::read_float_array,"memory.read_float_array",0)
         , nVar1 != '\0' &&
         (nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,int,int>
                            ("std.memory",NULLCMemory::read_double_array,"memory.read_double_array",
                             0), nVar1 != '\0')) &&
        (((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,bool*>
                             ("std.memory",NULLCMemory::read_into_bool,"memory.read",0),
          nVar1 != '\0' &&
          ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,char*>
                              ("std.memory",NULLCMemory::read_into_char,"memory.read",1),
           nVar1 != '\0' &&
           (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,short*>
                              ("std.memory",NULLCMemory::read_into_short,"memory.read",2),
           nVar1 != '\0')))) &&
         (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,int*>
                            ("std.memory",NULLCMemory::read_into_int,"memory.read",3), nVar1 != '\0'
         )))) && (((((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,long_long*>
                                        ("std.memory",NULLCMemory::read_into_long,"memory.read",4),
                     nVar1 != '\0' &&
                     (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,float*>
                                        ("std.memory",NULLCMemory::read_into_float,"memory.read",5),
                     nVar1 != '\0')) &&
                    (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,double*>
                                       ("std.memory",NULLCMemory::read_into_double,"memory.read",6),
                    nVar1 != '\0')) &&
                   ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                                       ("std.memory",NULLCMemory::read_into_bool_array,"memory.read"
                                        ,7), nVar1 != '\0' &&
                    (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                                       ("std.memory",NULLCMemory::read_into_char_array,"memory.read"
                                        ,8), nVar1 != '\0')))) &&
                  (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                                     ("std.memory",NULLCMemory::read_into_short_array,"memory.read",
                                      9), nVar1 != '\0')))))) &&
     (((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                          ("std.memory",NULLCMemory::read_into_int_array,"memory.read",10),
       nVar1 != '\0' &&
       (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                          ("std.memory",NULLCMemory::read_into_long_array,"memory.read",0xb),
       nVar1 != '\0')) &&
      ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                          ("std.memory",NULLCMemory::read_into_float_array,"memory.read",0xc),
       nVar1 != '\0' &&
       (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                          ("std.memory",NULLCMemory::read_into_double_array,"memory.read",0xd),
       nVar1 != '\0')))))) {
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,bool>
                      ("std.memory",NULLCMemory::write_bool,"memory.write",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,char>
                      ("std.memory",NULLCMemory::write_char,"memory.write",1);
    if ((((((nVar1 != '\0') &&
           (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,short>
                              ("std.memory",NULLCMemory::write_short,"memory.write",2),
           nVar1 != '\0')) &&
          (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,int>
                             ("std.memory",NULLCMemory::write_int,"memory.write",3), nVar1 != '\0'))
         && ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,long_long>
                                ("std.memory",NULLCMemory::write_long,"memory.write",4),
             nVar1 != '\0' &&
             (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,float>
                                ("std.memory",NULLCMemory::write_float,"memory.write",5),
             nVar1 != '\0')))) &&
        (((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,double>
                             ("std.memory",NULLCMemory::write_double,"memory.write",6),
          nVar1 != '\0' &&
          ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                              ("std.memory",NULLCMemory::write_bool_array,"memory.write",7),
           nVar1 != '\0' &&
           (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                              ("std.memory",NULLCMemory::write_char_array,"memory.write",8),
           nVar1 != '\0')))) &&
         ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                             ("std.memory",NULLCMemory::write_short_array,"memory.write",9),
          nVar1 != '\0' &&
          (((nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                               ("std.memory",NULLCMemory::write_int_array,"memory.write",10),
            nVar1 != '\0' &&
            (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                               ("std.memory",NULLCMemory::write_long_array,"memory.write",0xb),
            nVar1 != '\0')) &&
           (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                              ("std.memory",NULLCMemory::write_float_array,"memory.write",0xc),
           nVar1 != '\0')))))))) &&
       (nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray>
                          ("std.memory",NULLCMemory::write_double_array,"memory.write",0xd),
       nVar1 != '\0')) {
      nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,NULLCArray,int,int>
                        ("std.memory",NULLCMemory::copy,"memory.copy",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,int,char,int>
                        ("std.memory",NULLCMemory::set,"memory.set",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,int,NULLCArray,int,int>
                        ("std.memory",NULLCMemory::compare,"memory.compare",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<float,int>
                        ("std.memory",NULLCMemory::as_float,"memory.as_float",0);
      if (nVar1 != '\0') {
        nVar1 = nullcBindModuleFunctionHelper<double,long_long>
                          ("std.memory",NULLCMemory::as_double,"memory.as_double",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,float>
                          ("std.memory",NULLCMemory::as_int,"memory.as_int",0);
        if (nVar1 != '\0') {
          nVar1 = nullcBindModuleFunctionHelper<long_long,double>
                            ("std.memory",NULLCMemory::as_long,"memory.as_long",0);
          return nVar1 != '\0';
        }
        return false;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool nullcInitMemoryModule()
{
	REGISTER_FUNC(read_bool, "memory.read_bool", 0);
	REGISTER_FUNC(read_char, "memory.read_char", 0);
	REGISTER_FUNC(read_short, "memory.read_short", 0);
	REGISTER_FUNC(read_int, "memory.read_int", 0);
	REGISTER_FUNC(read_long, "memory.read_long", 0);
	REGISTER_FUNC(read_float, "memory.read_float", 0);
	REGISTER_FUNC(read_double, "memory.read_double", 0);

	REGISTER_FUNC(read_bool_array, "memory.read_bool_array", 0);
	REGISTER_FUNC(read_char_array, "memory.read_char_array", 0);
	REGISTER_FUNC(read_short_array, "memory.read_short_array", 0);
	REGISTER_FUNC(read_int_array, "memory.read_int_array", 0);
	REGISTER_FUNC(read_long_array, "memory.read_long_array", 0);
	REGISTER_FUNC(read_float_array, "memory.read_float_array", 0);
	REGISTER_FUNC(read_double_array, "memory.read_double_array", 0);

	REGISTER_FUNC(read_into_bool, "memory.read", 0);
	REGISTER_FUNC(read_into_char, "memory.read", 1);
	REGISTER_FUNC(read_into_short, "memory.read", 2);
	REGISTER_FUNC(read_into_int, "memory.read", 3);
	REGISTER_FUNC(read_into_long, "memory.read", 4);
	REGISTER_FUNC(read_into_float, "memory.read", 5);
	REGISTER_FUNC(read_into_double, "memory.read", 6);

	REGISTER_FUNC(read_into_bool_array, "memory.read", 7);
	REGISTER_FUNC(read_into_char_array, "memory.read", 8);
	REGISTER_FUNC(read_into_short_array, "memory.read", 9);
	REGISTER_FUNC(read_into_int_array, "memory.read", 10);
	REGISTER_FUNC(read_into_long_array, "memory.read", 11);
	REGISTER_FUNC(read_into_float_array, "memory.read", 12);
	REGISTER_FUNC(read_into_double_array, "memory.read", 13);

	REGISTER_FUNC(write_bool, "memory.write", 0);
	REGISTER_FUNC(write_char, "memory.write", 1);
	REGISTER_FUNC(write_short, "memory.write", 2);
	REGISTER_FUNC(write_int, "memory.write", 3);
	REGISTER_FUNC(write_long, "memory.write", 4);
	REGISTER_FUNC(write_float, "memory.write", 5);
	REGISTER_FUNC(write_double, "memory.write", 6);

	REGISTER_FUNC(write_bool_array, "memory.write", 7);
	REGISTER_FUNC(write_char_array, "memory.write", 8);
	REGISTER_FUNC(write_short_array, "memory.write", 9);
	REGISTER_FUNC(write_int_array, "memory.write", 10);
	REGISTER_FUNC(write_long_array, "memory.write", 11);
	REGISTER_FUNC(write_float_array, "memory.write", 12);
	REGISTER_FUNC(write_double_array, "memory.write", 13);

	REGISTER_FUNC(copy, "memory.copy", 0);
	REGISTER_FUNC(set, "memory.set", 0);
	REGISTER_FUNC(compare, "memory.compare", 0);

	REGISTER_FUNC(as_float, "memory.as_float", 0);
	REGISTER_FUNC(as_double, "memory.as_double", 0);
	REGISTER_FUNC(as_int, "memory.as_int", 0);
	REGISTER_FUNC(as_long, "memory.as_long", 0);

	return true;
}